

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_flags_for_ground_items.hpp
# Opt level: O3

void PatchFlagsForGroundItems::handle_set_flag_for_item_entity(ROM *rom)

{
  pointer pDVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  pointer pAVar4;
  uint32_t uVar5;
  Code *pCVar6;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  initializer_list<md::AddressRegister> __l_04;
  Code shop_hook_func;
  Code ground_hook_func;
  Code func;
  allocator_type local_269;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_268;
  uint32_t local_24c;
  undefined1 local_248 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_200;
  undefined1 local_1c8 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_180;
  AddressRegister local_148;
  undefined1 local_138 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_f0;
  AddressRegister local_b8;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_120._M_impl._0_1_ = 1;
  local_138._16_8_ = &PTR_getXn_00262be0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_138;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248,__l,
             (allocator_type *)&local_148);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       CONCAT31(local_268.
                super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                _M_impl.super__Vector_impl_data._M_finish._1_3_,7);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  md::Code::movem(&local_a8,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248
                  ,(vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,
                  true,(AddressRegister *)&local_268,LONG);
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  md::Code::clr(&local_a8,(Param *)local_138,LONG);
  local_138._0_8_ = &PTR_getXn_00262d18;
  local_138[0x10] = 5;
  local_138._8_8_ = &PTR_getXn_00262c50;
  local_120._M_impl._0_3_ = 0x2003a;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR_getXn_00262be0;
  md::Code::move(&local_a8,(Param *)local_138,(Param *)local_248,BYTE);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  md::Code::lsx(&local_a8,'\x02',(DataRegister *)local_138,false,BYTE);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_248[8] = '\x01';
  local_248._0_8_ = &PTR_getXn_00262be0;
  md::Code::move(&local_a8,(Param *)local_138,(Param *)local_248,LONG);
  local_248[8] = '\x01';
  local_248._0_8_ = &PTR_getXn_00262be0;
  local_138._0_8_ = &PTR_getXn_00262c98;
  local_138._8_8_ = (pointer)0x7;
  md::Code::andi(&local_a8,(ImmediateValue *)local_138,(Param *)local_248,BYTE);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  md::Code::lsx(&local_a8,'\x03',(DataRegister *)local_138,false,BYTE);
  local_248[8] = 1;
  local_248._0_8_ = &PTR_getXn_00262be0;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR_getXn_00262c50;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint32_t)
       local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
       _M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_138._0_8_ = &PTR_getXn_00262d58;
  local_120._M_impl._0_4_ = 2;
  local_120._M_impl._4_1_ = '\0';
  local_138._8_8_ = (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8;
  local_138._16_8_ = &local_268;
  md::Code::bset(&local_a8,(DataRegister *)local_248,(Param *)local_138);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_120._M_impl._0_1_ = 1;
  local_138._16_8_ = &PTR_getXn_00262be0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248,__l_00,
             (allocator_type *)&local_148);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       CONCAT31(local_268.
                super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                _M_impl.super__Vector_impl_data._M_finish._1_3_,7);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  md::Code::movem(&local_a8,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248
                  ,(vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,
                  false,(AddressRegister *)&local_268,LONG);
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  md::Code::rts(&local_a8);
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  local_24c = md::ROM::inject_code(rom,&local_a8,(string *)local_138);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_138._16_8_ = 0;
  local_138._0_8_ = (_func_int **)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248[8] = 2;
  local_248._0_8_ = &PTR_getXn_00262be0;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR_getXn_00262be0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::move((Code *)local_138,(Param *)local_248,(Param *)local_1c8,WORD);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR_getXn_00262be0;
  local_248._0_8_ = &PTR_getXn_00262c98;
  local_248._8_8_ = (pointer)0x7f;
  md::Code::cmpi((Code *)local_138,(ImmediateValue *)local_248,(Param *)local_1c8,BYTE);
  pDVar1 = (pointer)(local_248 + 0x10);
  local_248._0_8_ = pDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"archipelago","");
  md::Code::beq((Code *)local_138,(string *)local_248);
  if ((pointer)local_248._0_8_ != pDVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  local_248._0_8_ = &PTR_getXn_00262cd8;
  local_248._8_8_ = (pointer)0x2000291d6;
  md::Code::jsr((Code *)local_138,(Param *)local_248);
  local_248._0_8_ = pDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"archipelago","");
  md::Code::label((Code *)local_138,(string *)local_248);
  if ((pointer)local_248._0_8_ != pDVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_148.super_Register._code = '\0';
  local_148.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_01._M_len = 1;
  __l_01._M_array = &local_148;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,__l_01,
             (allocator_type *)&local_b8);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       CONCAT31(local_268.
                super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                _M_impl.super__Vector_impl_data._M_finish._1_3_,7);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  md::Code::movem((Code *)local_138,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248,
                  (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,
                  true,(AddressRegister *)&local_268,LONG);
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR_getXn_00262c50;
  local_248._0_8_ = &PTR_getXn_00262cd8;
  local_248._8_8_ = (pointer)0x200ff1060;
  md::Code::lea((Code *)local_138,(Param *)local_248,(AddressRegister *)local_1c8);
  local_248._0_8_ = &PTR_getXn_00262cd8;
  local_248._12_4_ = 2;
  local_248._8_4_ = local_24c;
  md::Code::jsr((Code *)local_138,(Param *)local_248);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_148.super_Register._code = '\0';
  local_148.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_02._M_len = 1;
  __l_02._M_array = &local_148;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,__l_02,
             (allocator_type *)&local_b8);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       CONCAT31(local_268.
                super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                _M_impl.super__Vector_impl_data._M_finish._1_3_,7);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  md::Code::movem((Code *)local_138,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_248,
                  (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)local_1c8,
                  false,(AddressRegister *)&local_268,LONG);
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  md::Code::rts((Code *)local_138);
  local_248._0_8_ = pDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
  uVar5 = md::ROM::inject_code(rom,(Code *)local_138,(string *)local_248);
  if ((pointer)local_248._0_8_ != pDVar1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  p_Var2 = &_Stack_230._M_impl.super__Rb_tree_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_230._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_200._M_impl._0_8_ = 0;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_248._16_8_ = (pointer)0x0;
  _Stack_230._M_impl._0_8_ = 0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  p_Var3 = &_Stack_200._M_impl.super__Rb_tree_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  _Stack_200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8._0_8_ = &PTR_getXn_00262cd8;
  local_1c8._12_4_ = 2;
  local_1c8._8_4_ = uVar5;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  pCVar6 = md::Code::jsr((Code *)local_248,(Param *)local_1c8);
  md::ROM::set_code(rom,0x24b1a,pCVar6);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_200);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_230);
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._0_8_ =
       _Stack_230._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_230._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._0_8_ =
       _Stack_200._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8[8] = 2;
  local_1c8._0_8_ = &PTR_getXn_00262be0;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint32_t)
       local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
       _M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  _Stack_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  _Stack_200._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  md::Code::move((Code *)local_248,(Param *)local_1c8,(Param *)&local_268,WORD);
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint32_t)
       local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
       _M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_1c8._0_8_ = &PTR_getXn_00262c98;
  local_1c8._8_8_ = (pointer)0x7f;
  md::Code::cmpi((Code *)local_248,(ImmediateValue *)local_1c8,(Param *)&local_268,BYTE);
  pAVar4 = (pointer)(local_1c8 + 0x10);
  local_1c8._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"archipelago","");
  md::Code::beq((Code *)local_248,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pAVar4) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  local_1c8._0_8_ = &PTR_getXn_00262cd8;
  local_1c8._8_8_ = (pointer)0x2000291d6;
  md::Code::jsr((Code *)local_248,(Param *)local_1c8);
  local_1c8._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"archipelago","");
  md::Code::label((Code *)local_248,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pAVar4) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_03._M_len = 1;
  __l_03._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_268,__l_03,&local_269);
  local_148.super_Register._code = '\a';
  local_148.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem((Code *)local_248,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_1c8,
                  &local_268,true,&local_148,LONG);
  if (local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint32_t)
       local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
       _M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_1c8._0_8_ = &PTR_getXn_00262cd8;
  local_1c8._8_8_ = (pointer)0x200ff1064;
  md::Code::lea((Code *)local_248,(Param *)local_1c8,(AddressRegister *)&local_268);
  local_1c8._0_8_ = &PTR_getXn_00262cd8;
  local_1c8._12_4_ = 2;
  local_1c8._8_4_ = local_24c;
  md::Code::jsr((Code *)local_248,(Param *)local_1c8);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_04._M_len = 1;
  __l_04._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_268,__l_04,&local_269);
  local_148.super_Register._code = '\a';
  local_148.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem((Code *)local_248,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_1c8,
                  &local_268,false,&local_148,LONG);
  if (local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  md::Code::rts((Code *)local_248);
  local_1c8._0_8_ = pAVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
  uVar5 = md::ROM::inject_code(rom,(Code *)local_248,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pAVar4) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  _Stack_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_1b0._M_impl.super__Rb_tree_header._M_header;
  _Stack_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_180._M_impl._0_8_ = 0;
  _Stack_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_1b0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  _Stack_1b0._M_impl._0_8_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  _Stack_180._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_180._M_impl.super__Rb_tree_header._M_header;
  _Stack_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_180._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_180._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262cd8;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 2;
  local_268.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = uVar5;
  _Stack_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_180._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_180._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar6 = md::Code::jsr((Code *)local_1c8,(Param *)&local_268);
  md::ROM::set_code(rom,0x24f3e,pCVar6);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_180);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_1b0);
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_200);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_230);
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_120);
  if ((_func_int **)local_138._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void handle_set_flag_for_item_entity(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D0, reg_D1 }, {});
        {
            func.clrl(reg_D0);
            func.moveb(addr_(reg_A5, OFFSET_ENTITY_GROUND_ITEM_ID), reg_D0);
            func.lsrb(2, reg_D0);                                               // D0 contains flag ID
            func.movel(reg_D0, reg_D1);
            func.andib(0x07, reg_D1);                                           // D1 contains flag bit
            func.lsrb(3, reg_D0);                                               // D0 contains flag byte
            func.bset(reg_D1, addr_(reg_A0, reg_D0));
        }
        func.movem_from_stack({ reg_D0, reg_D1 }, {});
        func.rts();
        uint32_t func_set_flag_addr = rom.inject_code(func);

        // Add a procedure extension to call the new set_flag function when grabbing a ground item
        md::Code ground_hook_func;
        {
            ground_hook_func.movew(reg_D2, reg_D0);
            ground_hook_func.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            ground_hook_func.beq("archipelago");
            {
                // If item is an Archipelago item, don't call the GetItem function
                ground_hook_func.jsr(0x291D6);  // GetItem
            }
            ground_hook_func.label("archipelago");

            ground_hook_func.movem_to_stack({}, { reg_A0 });
            ground_hook_func.lea(GROUND_ITEM_FLAGS_START_ADDR, reg_A0);
            ground_hook_func.jsr(func_set_flag_addr);
            ground_hook_func.movem_from_stack({}, { reg_A0 });
        }
        ground_hook_func.rts();
        uint32_t ground_hook_func_addr = rom.inject_code(ground_hook_func);
        rom.set_code(0x24B1A, md::Code().jsr(ground_hook_func_addr));  // Ground items

        // Add a procedure extension to call the new set_flag function when buying a shop item
        md::Code shop_hook_func;
        {
            shop_hook_func.movew(reg_D2, reg_D0);
            shop_hook_func.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            shop_hook_func.beq("archipelago");
            {
                // If item is an Archipelago item, don't call the GetItem function
                shop_hook_func.jsr(0x291D6);  // GetItem
            }
            shop_hook_func.label("archipelago");

            shop_hook_func.movem_to_stack({}, { reg_A0 });
            shop_hook_func.lea(SHOP_ITEM_FLAGS_START_ADDR, reg_A0);
            shop_hook_func.jsr(func_set_flag_addr);
            shop_hook_func.movem_from_stack({}, { reg_A0 });
        }
        shop_hook_func.rts();
        uint32_t shop_hook_func_addr = rom.inject_code(shop_hook_func);
        rom.set_code(0x24F3E, md::Code().jsr(shop_hook_func_addr));  // Shop items
    }